

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QCborArray *value)

{
  long in_FS_OFFSET;
  QCborArray local_70;
  QArrayDataPointer<char> local_68;
  QCborValue local_48;
  QCborParserError local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char *)0x0;
  local_68.size = 0;
  operator>>(stream,(QByteArray *)&local_68);
  local_30.offset = 0;
  local_30.error.c = NoError;
  local_30._12_4_ = 0xaaaaaaaa;
  QCborValue::fromCbor(&local_48,(QByteArray *)&local_68,&local_30);
  QCborValue::toArray((QCborValue *)&local_70);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&value->d,(QCborContainerPrivate *)local_70.d.d.ptr);
  QCborArray::~QCborArray(&local_70);
  QCborValue::~QCborValue((QCborValue *)&local_48);
  if (local_30.error.c != NoError) {
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborArray &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError).toArray();
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}